

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_diff_equivnode(lyd_node *first,lyd_node *second)

{
  int iVar1;
  lyd_node *local_30;
  lyd_node *iter2;
  lyd_node *iter1;
  lyd_node *second_local;
  lyd_node *first_local;
  
  local_30 = second;
  iter2 = first;
  while( true ) {
    if (iter2 == (lyd_node *)0x0 || local_30 == (lyd_node *)0x0) {
      first_local._4_4_ = (uint)(iter2 == local_30);
      return first_local._4_4_;
    }
    if (iter2->schema->module->ctx == local_30->schema->module->ctx) {
      if (iter2->schema != local_30->schema) {
        return 0;
      }
    }
    else {
      iVar1 = ly_strequal_(iter2->schema->name,local_30->schema->name);
      if (iVar1 == 0) {
        return 0;
      }
    }
    if ((iter2->schema->nodetype == LYS_LIST) &&
       (iVar1 = lyd_list_equal(iter2,local_30,0), iVar1 != 1)) break;
    iter2 = iter2->parent;
    local_30 = local_30->parent;
  }
  return 0;
}

Assistant:

static int
lyd_diff_equivnode(struct lyd_node *first, struct lyd_node *second)
{
    struct lyd_node *iter1, *iter2;

    for (iter1 = first, iter2 = second; iter1 && iter2; iter1 = iter1->parent, iter2 = iter2->parent) {
        if (iter1->schema->module->ctx == iter2->schema->module->ctx) {
            if (iter1->schema != iter2->schema) {
                return 0;
            }
        } else {
            if (!ly_strequal(iter1->schema->name, iter2->schema->name, 0)) {
                /* comparing the names is fine, even if they are, in fact, 2 different nodes
                 * with equal names, some of their parents will differ */
                return 0;
            }
        }
        if (iter1->schema->nodetype == LYS_LIST) {
            /* compare keys */
            if (lyd_list_equal(iter1, iter2, 0) != 1) {
                return 0;
            }
        }
    }

    if (iter1 != iter2) {
        /* we are supposed to be in root (NULL) in both trees */
        return 0;
    }

    return 1;
}